

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prettywriter.h
# Opt level: O0

void __thiscall
rapidjson::
PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::PrettyPrefix(PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
               *this,Type type)

{
  size_t sVar1;
  Level *pLVar2;
  Level *level;
  Type type_local;
  PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  *this_local;
  
  sVar1 = internal::Stack<rapidjson::CrtAllocator>::GetSize
                    (&(this->
                      super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                      ).level_stack_);
  if (sVar1 == 0) {
    if ((((this->
          super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
          ).hasRoot_ ^ 0xffU) & 1) == 0) {
      __assert_fail("!Base::hasRoot_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/prettywriter.h"
                    ,0xeb,
                    "void rapidjson::PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<>>>::PrettyPrefix(Type) [OutputStream = rapidjson::GenericStringBuffer<rapidjson::UTF8<>>, SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, writeFlags = 0]"
                   );
    }
    (this->
    super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
    ).hasRoot_ = true;
  }
  else {
    pLVar2 = internal::Stack<rapidjson::CrtAllocator>::
             Top<rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>::Level>
                       (&(this->
                         super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                         ).level_stack_);
    if ((pLVar2->inArray & 1U) == 0) {
      if (pLVar2->valueCount == 0) {
        GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Put
                  ((this->
                   super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                   ).os_,'\n');
      }
      else if ((pLVar2->valueCount & 1) == 0) {
        GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Put
                  ((this->
                   super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                   ).os_,',');
        GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Put
                  ((this->
                   super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                   ).os_,'\n');
      }
      else {
        GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Put
                  ((this->
                   super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                   ).os_,':');
        GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Put
                  ((this->
                   super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                   ).os_,' ');
      }
      if ((pLVar2->valueCount & 1) == 0) {
        WriteIndent(this);
      }
    }
    else {
      if ((pLVar2->valueCount != 0) &&
         (GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Put
                    ((this->
                     super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                     ).os_,','), (this->formatOptions_ & kFormatSingleLineArray) != kFormatDefault))
      {
        GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Put
                  ((this->
                   super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                   ).os_,' ');
      }
      if ((this->formatOptions_ & kFormatSingleLineArray) == kFormatDefault) {
        GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Put
                  ((this->
                   super_Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
                   ).os_,'\n');
        WriteIndent(this);
      }
    }
    if ((((pLVar2->inArray & 1U) == 0) && ((pLVar2->valueCount & 1) == 0)) && (type != kStringType))
    {
      __assert_fail("type == kStringType",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/prettywriter.h"
                    ,0xe7,
                    "void rapidjson::PrettyWriter<rapidjson::GenericStringBuffer<rapidjson::UTF8<>>>::PrettyPrefix(Type) [OutputStream = rapidjson::GenericStringBuffer<rapidjson::UTF8<>>, SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, writeFlags = 0]"
                   );
    }
    pLVar2->valueCount = pLVar2->valueCount + 1;
  }
  return;
}

Assistant:

void PrettyPrefix(Type type) {
        (void)type;
        if (Base::level_stack_.GetSize() != 0) { // this value is not at root
            typename Base::Level* level = Base::level_stack_.template Top<typename Base::Level>();

            if (level->inArray) {
                if (level->valueCount > 0) {
                    Base::os_->Put(','); // add comma if it is not the first element in array
                    if (formatOptions_ & kFormatSingleLineArray)
                        Base::os_->Put(' ');
                }

                if (!(formatOptions_ & kFormatSingleLineArray)) {
                    Base::os_->Put('\n');
                    WriteIndent();
                }
            }
            else {  // in object
                if (level->valueCount > 0) {
                    if (level->valueCount % 2 == 0) {
                        Base::os_->Put(',');
                        Base::os_->Put('\n');
                    }
                    else {
                        Base::os_->Put(':');
                        Base::os_->Put(' ');
                    }
                }
                else
                    Base::os_->Put('\n');

                if (level->valueCount % 2 == 0)
                    WriteIndent();
            }
            if (!level->inArray && level->valueCount % 2 == 0)
                RAPIDJSON_ASSERT(type == kStringType);  // if it's in object, then even number should be a name
            level->valueCount++;
        }
        else {
            RAPIDJSON_ASSERT(!Base::hasRoot_);  // Should only has one and only one root.
            Base::hasRoot_ = true;
        }
    }